

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepFaceArray::Write(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  uint i;
  ON_BrepFace *pOVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  int local_38;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  
  bVar4 = false;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar2) {
    iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
    bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(0x45 < iVar5) + 1);
    if (bVar2) {
      i = (this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>.m_count;
      uVar10 = (ulong)i;
      local_38 = iVar5;
      bVar3 = ON_BinaryArchive::WriteInt(file,i);
      if (0 < (int)i && (bool)bVar3) {
        lVar9 = 0;
        uVar8 = 1;
        do {
          pOVar1 = (this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>.m_a;
          bVar3 = (**(code **)(*(long *)((pOVar1->m_face_uuid).Data4 + lVar9 + -0x5c) + 0x50))
                            ((pOVar1->m_face_uuid).Data4 + lVar9 + -0x5c);
          if (bVar3 == 0) break;
          lVar9 = lVar9 + 0xd8;
          bVar2 = uVar8 < uVar10;
          uVar8 = uVar8 + 1;
        } while (bVar2);
      }
      if ((0 < (int)i & bVar3) == 1) {
        lVar9 = 0x54;
        uVar8 = 1;
        do {
          bVar3 = ON_BinaryArchive::WriteUuid
                            (file,(ON_UUID *)
                                  ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                     super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                  lVar9 + -0x5c));
          if (!(bool)bVar3) break;
          lVar9 = lVar9 + 0xd8;
          bVar2 = uVar8 < uVar10;
          uVar8 = uVar8 + 1;
        } while (bVar2);
      }
      if ((0x45 < local_38) && (bVar3 != 0)) {
        if ((int)i < 1) {
          bVar3 = ON_BinaryArchive::WriteBool(file,false);
        }
        else {
          uVar6 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
          local_3c = (anon_union_4_2_6147a14e_for_ON_Color_15)
                     ON_BrepFace::PerFaceColor
                               ((this->super_ON_ObjectArray<ON_BrepFace>).
                                super_ON_ClassArray<ON_BrepFace>.m_a);
          uVar7 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_3c);
          bVar2 = true;
          if (uVar6 == uVar7) {
            uVar8 = 0;
            do {
              uVar8 = uVar8 + 1;
              if (uVar8 == uVar10) break;
              uVar6 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
              local_3c = (anon_union_4_2_6147a14e_for_ON_Color_15)
                         ON_BrepFace::PerFaceColor
                                   ((this->super_ON_ObjectArray<ON_BrepFace>).
                                    super_ON_ClassArray<ON_BrepFace>.m_a + uVar8);
              uVar7 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_3c);
            } while (uVar6 == uVar7);
            bVar2 = uVar8 < uVar10;
          }
          bVar3 = ON_BinaryArchive::WriteBool(file,bVar2);
          if ((bVar2 & 0 < (int)i & bVar3) == 1) {
            lVar9 = 0;
            uVar8 = 1;
            do {
              local_34 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                         ON_BrepFace::PerFaceColor
                                   ((ON_BrepFace *)
                                    ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                       super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                    lVar9 + -0x5c));
              bVar3 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_34);
              if (!(bool)bVar3) break;
              lVar9 = lVar9 + 0xd8;
              bVar2 = uVar8 < uVar10;
              uVar8 = uVar8 + 1;
            } while (bVar2);
          }
        }
      }
    }
    else {
      bVar3 = 0;
    }
    bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar4 = (bool)(bVar4 & bVar3);
  }
  return bVar4;
}

Assistant:

bool ON_BrepFaceArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) 
  {
    // 1.1 added m_face_uuid
    // 1.2 added m_per_face_color
    const int minor_version = file.Archive3dmVersion() >= 70 ? 2 : 1;
    rc = file.Write3dmChunkVersion(1, minor_version);

    // chunk version 1.0 and later
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) 
    {
      if (rc) rc = m_a[i].Write(file);
    }

    // chunk version 1.1 and later
    for ( i = 0; rc && i < count; i++ )
    {
      rc = file.WriteUuid( m_a[i].m_face_uuid );
    }

    if (rc && minor_version >= 2)
    {
      // 1.2 added optional per face colors
      bool bHavePerFaceColors = false;
      for (i = 0; rc && i < count; i++)
      {
        if (ON_Color::UnsetColor != m_a[i].PerFaceColor())
        {
          bHavePerFaceColors = true;
          break;
        }
      }

      rc = file.WriteBool(bHavePerFaceColors);
      if (rc && bHavePerFaceColors)
      {
        for (i = 0; rc && i < count; i++)
          rc = file.WriteColor(m_a[i].PerFaceColor());
      }
    }

    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}